

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

EVP_PKEY * EVP_parse_private_key(CBS *cbs)

{
  int iVar1;
  EVP_PKEY_ASN1_METHOD *method;
  EVP_PKEY *pkey;
  EVP_PKEY *pEVar2;
  int line;
  uint64_t version;
  CBS pkcs8;
  CBS algorithm;
  CBS key;
  uint64_t local_48;
  CBS local_40;
  CBS local_30;
  CBS local_20;
  
  iVar1 = CBS_get_asn1(cbs,&local_40,0x20000010);
  if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1_uint64(&local_40,&local_48), iVar1 == 0)) ||
      (local_48 != 0)) ||
     ((iVar1 = CBS_get_asn1(&local_40,&local_30,0x20000010), iVar1 == 0 ||
      (iVar1 = CBS_get_asn1(&local_40,&local_20,4), iVar1 == 0)))) {
    iVar1 = 0x66;
    line = 0x75;
  }
  else {
    method = parse_key_type(&local_30);
    if (method != (EVP_PKEY_ASN1_METHOD *)0x0) {
      pkey = EVP_PKEY_new();
      pEVar2 = pkey;
      if (pkey == (EVP_PKEY *)0x0) {
        pkey = (EVP_PKEY *)0x0;
      }
      else {
        evp_pkey_set_method((EVP_PKEY *)pkey,method);
        if (*(code **)(pkey->ameth + 0x30) == (code *)0x0) {
          ERR_put_error(6,0,0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                        ,0x89);
          pkey = (EVP_PKEY *)0x0;
        }
        else {
          iVar1 = (**(code **)(pkey->ameth + 0x30))(pkey,&local_30,&local_20);
          pEVar2 = (EVP_PKEY *)0x0;
          if (iVar1 == 0) {
            pEVar2 = pkey;
            pkey = (EVP_PKEY *)0x0;
          }
        }
      }
      if (pEVar2 == (EVP_PKEY *)0x0) {
        return (EVP_PKEY *)pkey;
      }
      EVP_PKEY_free(pEVar2);
      return (EVP_PKEY *)pkey;
    }
    iVar1 = 0x80;
    line = 0x7a;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                ,line);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_parse_private_key(CBS *cbs) {
  // Parse the PrivateKeyInfo.
  CBS pkcs8, algorithm, key;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&pkcs8, &version) ||
      version != 0 ||
      !CBS_get_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pkcs8, &key, CBS_ASN1_OCTETSTRING)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }

  // A PrivateKeyInfo ends with a SET of Attributes which we ignore.

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific PrivateKeyInfo decoding function.
  if (ret->ameth->priv_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->priv_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}